

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O3

void apply_motor_speed(SpurUserParamsPtr spur)

{
  MotorControlMode MVar1;
  int iVar2;
  ParametersPtr p_Var3;
  longlong value64;
  char param;
  motor_id motor;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  uVar4 = 0;
  p_Var3 = get_param_ptr();
  spur->run_mode_cnt = spur->run_mode_cnt + 1;
  do {
    if (p_Var3->motor_enable[uVar4] != 0) {
      motor = (motor_id)uVar4;
      dVar6 = p(YP_PARAM_CONTROL_MODE_RESEND,motor);
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        dVar6 = p(YP_PARAM_CONTROL_MODE_RESEND,motor);
        dVar7 = p(YP_PARAM_CONTROL_CYCLE,motor);
        bVar5 = spur->run_mode_cnt % (int)(dVar6 / dVar7) ==
                (int)((long)((ulong)(uint)((int)motor >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                     (long)(int)(dVar6 / dVar7));
      }
      else {
        bVar5 = false;
      }
      MVar1 = spur->wheel_mode[uVar4];
      if ((bVar5) || (MVar1 != spur->wheel_mode_prev[uVar4])) {
        if (MVar1 < (MOTOR_CONTROL_ANGLE|MOTOR_CONTROL_VEHICLE)) {
          parameter_set('@',(char)uVar4,*(longlong *)(&DAT_00112220 + (ulong)MVar1 * 8));
        }
        MVar1 = spur->wheel_mode[uVar4];
      }
      spur->wheel_mode_prev[uVar4] = MVar1;
      if (MVar1 - MOTOR_CONTROL_VEHICLE < 4) {
        iVar2 = option(OPTION_HIGH_PREC);
        dVar6 = spur->wheel_vel_smooth[uVar4];
        if (iVar2 == 0) {
          dVar7 = p(YP_PARAM_GEAR,motor);
          dVar8 = p(YP_PARAM_COUNT_REV,motor);
          dVar9 = p(YP_PARAM_CYCLE,motor);
          value64 = (longlong)(int)((dVar9 * dVar8 * dVar6 * dVar7) / 6.283185307179586);
          param = '\0';
        }
        else {
          dVar7 = p(YP_PARAM_GEAR,motor);
          dVar8 = p(YP_PARAM_COUNT_REV,motor);
          dVar9 = p(YP_PARAM_CYCLE,motor);
          value64 = (longlong)(int)((dVar9 * dVar8 * dVar7 * dVar6 * 16.0) / 6.283185307179586);
          param = '\x01';
        }
      }
      else {
        if (MOTOR_CONTROL_FREE < MVar1) goto LAB_001090df;
        param = '\0';
        value64 = 0;
      }
      parameter_set(param,(char)uVar4,value64);
    }
LAB_001090df:
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void apply_motor_speed(SpurUserParamsPtr spur)
{
  int i;
  ParametersPtr param;
  param = get_param_ptr();
  spur->run_mode_cnt++;

  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    int v;
    if (!param->motor_enable[i])
      continue;

    int force_send_control_mode = 0;
    if (p(YP_PARAM_CONTROL_MODE_RESEND, i) != 0.0)
    {
      int cnt_max = p(YP_PARAM_CONTROL_MODE_RESEND, i) / p(YP_PARAM_CONTROL_CYCLE, i);
      if (spur->run_mode_cnt % cnt_max == i % cnt_max)
        force_send_control_mode = 1;
    }

    if (spur->wheel_mode[i] != spur->wheel_mode_prev[i] || force_send_control_mode)
    {
      switch (spur->wheel_mode[i])
      {
        case MOTOR_CONTROL_OPENFREE:
          parameter_set(PARAM_servo, i, SERVO_LEVEL_OPENFREE);
          break;
        case MOTOR_CONTROL_FREE:
          parameter_set(PARAM_servo, i, SERVO_LEVEL_TORQUE);
          break;
        case MOTOR_CONTROL_ANGLE:
        case MOTOR_CONTROL_ANGLE_VEL:
        case MOTOR_CONTROL_VEL:
        case MOTOR_CONTROL_VEHICLE:
          parameter_set(PARAM_servo, i, SERVO_LEVEL_VELOCITY);
          break;
      }
    }
    spur->wheel_mode_prev[i] = spur->wheel_mode[i];

    switch (spur->wheel_mode[i])
    {
      case MOTOR_CONTROL_OPENFREE:
      case MOTOR_CONTROL_FREE:
        parameter_set(PARAM_w_ref, i, 0);
        break;
      case MOTOR_CONTROL_ANGLE:
      case MOTOR_CONTROL_ANGLE_VEL:
      case MOTOR_CONTROL_VEL:
      case MOTOR_CONTROL_VEHICLE:
        if (option(OPTION_HIGH_PREC))
        {
          v = (double)(16 * spur->wheel_vel_smooth[i] *
                       p(YP_PARAM_GEAR, i) * p(YP_PARAM_COUNT_REV, i) * p(YP_PARAM_CYCLE, i) /
                       (2 * M_PI));
          parameter_set(PARAM_w_ref_highprec, i, v);
        }
        else
        {
          v = (double)(spur->wheel_vel_smooth[i] *
                       p(YP_PARAM_GEAR, i) * p(YP_PARAM_COUNT_REV, i) * p(YP_PARAM_CYCLE, i) /
                       (2 * M_PI));
          parameter_set(PARAM_w_ref, i, v);
        }
        break;
    }
  }
}